

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaLf.c
# Opt level: O0

float Lf_CutArea(Lf_Man_t *p,Lf_Cut_t *pCut)

{
  uint uVar1;
  float fVar2;
  bool local_35;
  bool local_29;
  Lf_Cut_t *pCut_local;
  Lf_Man_t *p_local;
  
  if ((*(uint *)&pCut->field_0x14 >> 0x18 < 2) || ((*(uint *)&pCut->field_0x14 >> 0x17 & 1) != 0)) {
    p_local._4_4_ = 0.0;
  }
  else if (p->pPars->fPower == 0) {
    if (p->pPars->fOptEdge == 0) {
      local_35 = false;
      if (p->pPars->fCutGroup != 0) {
        local_35 = p->pPars->nLutSize / 2 < (int)(*(uint *)&pCut->field_0x14 >> 0x18);
      }
      p_local._4_4_ = (float)(byte)(local_35 + 1);
    }
    else {
      local_29 = false;
      if (p->pPars->fCutGroup != 0) {
        local_29 = p->pPars->nLutSize / 2 < (int)(*(uint *)&pCut->field_0x14 >> 0x18);
      }
      p_local._4_4_ =
           (float)(int)(((*(uint *)&pCut->field_0x14 >> 0x18) + p->pPars->nAreaTuner) *
                       (local_29 + 1));
    }
  }
  else {
    uVar1 = *(uint *)&pCut->field_0x14;
    fVar2 = Lf_CutSwitches(p,pCut);
    p_local._4_4_ = (float)(uVar1 >> 0x18) + fVar2;
  }
  return p_local._4_4_;
}

Assistant:

static inline float Lf_CutArea( Lf_Man_t * p, Lf_Cut_t * pCut )
{
    if ( pCut->nLeaves < 2 || pCut->fMux7 )
        return 0;
    if ( p->pPars->fPower )
        return 1.0 * pCut->nLeaves + Lf_CutSwitches( p, pCut );
    if ( p->pPars->fOptEdge )
        return (pCut->nLeaves + p->pPars->nAreaTuner) * (1 + (p->pPars->fCutGroup && (int)pCut->nLeaves > p->pPars->nLutSize/2));
    return 1 + (p->pPars->fCutGroup && (int)pCut->nLeaves > p->pPars->nLutSize/2);
}